

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O3

void __thiscall QtMWidgets::ToolBar::actionEvent(ToolBar *this,QActionEvent *event)

{
  short sVar1;
  QAction *action;
  ToolBarLayout *pTVar2;
  int iVar3;
  ToolButton *this_00;
  long *plVar4;
  
  sVar1 = *(short *)(event + 8);
  if (sVar1 == 0x71) {
    (**(code **)(*(long *)((this->d).d)->layout + 0x70))();
    return;
  }
  action = *(QAction **)(event + 0x10);
  if (sVar1 == 0x73) {
    iVar3 = ToolBarLayout::indexOf(((this->d).d)->layout,action);
    if (iVar3 != -1) {
      pTVar2 = ((this->d).d)->layout;
      plVar4 = (long *)(**(code **)(*(long *)pTVar2 + 0xb0))(pTVar2,iVar3);
      if (plVar4 != (long *)0x0) {
        (**(code **)(*plVar4 + 8))(plVar4);
        return;
      }
    }
  }
  else if (sVar1 == 0x72) {
    this_00 = (ToolButton *)operator_new(0x30);
    ToolButton::ToolButton(this_00,action,&this->super_QWidget);
    ToolButton::setIconSize(this_00,&((this->d).d)->iconSize);
    ToolBarLayout::addButton(((this->d).d)->layout,this_00);
    QWidget::show();
    return;
  }
  return;
}

Assistant:

void
ToolBar::actionEvent( QActionEvent * event )
{
	QAction * action = event->action();

	switch( event->type() )
	{
		case QEvent::ActionAdded :
		{
			ToolButton * b = new ToolButton( action, this );
			b->setIconSize( d->iconSize );
			d->layout->addButton( b );
			b->show();
		}
			break;

		case QEvent::ActionChanged :
			d->layout->invalidate();
			break;

		case QEvent::ActionRemoved :
		{
			int index = d->layout->indexOf( action );
			if( index != -1 )
				delete d->layout->takeAt( index );
		}
			break;

		default :
			break;
	}
}